

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

void __thiscall
MT32Emu::RendererImpl<short>::doRenderAndConvertStreams<float>
          (RendererImpl<short> *this,DACOutputStreams<float> *streams,Bit32u len)

{
  Bit32u len_00;
  DACOutputStreams<float> tmpStreams;
  DACOutputStreams<short> cnvStreams;
  short cnvReverbWetRight [4096];
  short cnvReverbWetLeft [4096];
  short cnvReverbDryRight [4096];
  short cnvReverbDryLeft [4096];
  short cnvNonReverbRight [4096];
  short cnvNonReverbLeft [4096];
  DACOutputStreams<float> local_c098;
  DACOutputStreams<short> local_c068;
  short local_c038 [4096];
  short local_a038 [4096];
  short local_8038 [4096];
  short local_6038 [4096];
  short local_4038 [4096];
  short local_2038 [4100];
  
  local_c068.nonReverbLeft = local_2038;
  local_c068.nonReverbRight = local_4038;
  local_c068.reverbDryLeft = local_6038;
  local_c068.reverbDryRight = local_8038;
  local_c068.reverbWetLeft = local_a038;
  local_c068.reverbWetRight = local_c038;
  local_c098.nonReverbLeft = streams->nonReverbLeft;
  local_c098.nonReverbRight = streams->nonReverbRight;
  local_c098.reverbDryLeft = streams->reverbDryLeft;
  local_c098.reverbDryRight = streams->reverbDryRight;
  local_c098.reverbWetLeft = streams->reverbWetLeft;
  local_c098.reverbWetRight = streams->reverbWetRight;
  for (; len != 0; len = len - len_00) {
    len_00 = 0x1000;
    if (len < 0x1000) {
      len_00 = len;
    }
    doRenderStreams(this,&local_c068,len_00);
    convertSampleFormat<short,float>(local_c068.nonReverbLeft,local_c098.nonReverbLeft,len_00);
    convertSampleFormat<short,float>(local_c068.nonReverbRight,local_c098.nonReverbRight,len_00);
    convertSampleFormat<short,float>(local_c068.reverbDryLeft,local_c098.reverbDryLeft,len_00);
    convertSampleFormat<short,float>(local_c068.reverbDryRight,local_c098.reverbDryRight,len_00);
    convertSampleFormat<short,float>(local_c068.reverbWetLeft,local_c098.reverbWetLeft,len_00);
    convertSampleFormat<short,float>(local_c068.reverbWetRight,local_c098.reverbWetRight,len_00);
    advanceStreams<float>(&local_c098,len_00);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvertStreams(const DACOutputStreams<O> &streams, Bit32u len) {
	Sample cnvNonReverbLeft[MAX_SAMPLES_PER_RUN], cnvNonReverbRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbDryLeft[MAX_SAMPLES_PER_RUN], cnvReverbDryRight[MAX_SAMPLES_PER_RUN];
	Sample cnvReverbWetLeft[MAX_SAMPLES_PER_RUN], cnvReverbWetRight[MAX_SAMPLES_PER_RUN];

	const DACOutputStreams<Sample> cnvStreams = {
		cnvNonReverbLeft, cnvNonReverbRight,
		cnvReverbDryLeft, cnvReverbDryRight,
		cnvReverbWetLeft, cnvReverbWetRight
	};

	DACOutputStreams<O> tmpStreams = streams;

	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRenderStreams(cnvStreams, thisPassLen);
		convertStreamsFormat(cnvStreams, tmpStreams, thisPassLen);
		advanceStreams(tmpStreams, thisPassLen);
		len -= thisPassLen;
	}
}